

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

int equal_nocase(uchar *pattern,size_t pattern_len,uchar *subject,size_t subject_len,uint flags)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  
  if (pattern_len == subject_len) {
    do {
      if (pattern_len == 0) {
        return 1;
      }
      bVar1 = *pattern;
      if (bVar1 == 0) {
LAB_001ad65c:
        bVar3 = false;
      }
      else {
        bVar2 = *subject;
        if (bVar1 != bVar2) {
          iVar4 = OPENSSL_tolower((uint)bVar1);
          iVar5 = OPENSSL_tolower((uint)bVar2);
          if (iVar4 != iVar5) goto LAB_001ad65c;
        }
        pattern = pattern + 1;
        subject = subject + 1;
        pattern_len = pattern_len - 1;
        bVar3 = true;
      }
    } while (bVar3);
  }
  return 0;
}

Assistant:

static int equal_nocase(const unsigned char *pattern, size_t pattern_len,
                        const unsigned char *subject, size_t subject_len,
                        unsigned int flags) {
  if (pattern_len != subject_len) {
    return 0;
  }
  while (pattern_len) {
    unsigned char l = *pattern;
    unsigned char r = *subject;
    // The pattern must not contain NUL characters.
    if (l == 0) {
      return 0;
    }
    if (l != r) {
      if (OPENSSL_tolower(l) != OPENSSL_tolower(r)) {
        return 0;
      }
    }
    ++pattern;
    ++subject;
    --pattern_len;
  }
  return 1;
}